

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(char *str_id)

{
  ImGuiID IVar1;
  char *in_RDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  uint *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  IVar1 = ImGuiWindow::GetID(unaff_retaddr,in_RDI,&GImGui->Initialized);
  ImVector<unsigned_int>::push_back
            ((ImVector<unsigned_int> *)CONCAT44(IVar1,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void ImGui::PushID(const char* str_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(str_id);
    window->IDStack.push_back(id);
}